

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O0

void ssh2_bpp_new_incoming_crypto
               (BinaryPacketProtocol *bpp,ssh_cipheralg *cipher,void *ckey,void *iv,ssh2_macalg *mac
               ,_Bool etm_mode,void *mac_key,ssh_compression_alg *compression,
               _Bool delayed_compression)

{
  LogContext *pLVar1;
  undefined8 uVar2;
  ssh_cipher *psVar3;
  ssh_cipheralg *psVar4;
  char *pcVar5;
  IdempotentCallback *pIVar6;
  char *pcVar7;
  ssh_decompressor *psVar8;
  ssh_compression_alg *psVar9;
  char *pcVar10;
  bool bVar11;
  ptrlen key;
  ssh2_bpp_state *s;
  _Bool delayed_compression_local;
  _Bool etm_mode_local;
  ssh2_macalg *mac_local;
  void *iv_local;
  void *ckey_local;
  ssh_cipheralg *cipher_local;
  BinaryPacketProtocol *bpp_local;
  
  if (bpp->vt != &ssh2_bpp_vtable) {
    __assert_fail("bpp->vt == &ssh2_bpp_vtable",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp2.c",
                  0xb7,
                  "void ssh2_bpp_new_incoming_crypto(BinaryPacketProtocol *, const ssh_cipheralg *, const void *, const void *, const ssh2_macalg *, _Bool, const void *, const ssh_compression_alg *, _Bool)"
                 );
  }
  ssh2_bpp_free_incoming_crypto((ssh2_bpp_state *)&bpp[-2].remote_bugs);
  if (cipher == (ssh_cipheralg *)0x0) {
    bpp[-1].out_pq.pqb.total_size = 0;
  }
  else {
    psVar3 = ssh_cipher_new(cipher);
    bpp[-1].out_pq.pqb.total_size = (size_t)psVar3;
    ssh_cipher_setkey((ssh_cipher *)bpp[-1].out_pq.pqb.total_size,ckey);
    ssh_cipher_setiv((ssh_cipher *)bpp[-1].out_pq.pqb.total_size,iv);
    pLVar1 = bpp->logctx;
    psVar4 = ssh_cipher_alg((ssh_cipher *)bpp[-1].out_pq.pqb.total_size);
    pcVar5 = dupprintf("Initialised %s inbound encryption",psVar4->text_name);
    logevent_and_free(pLVar1,pcVar5);
  }
  *(_Bool *)&bpp[-1].out_pq.after = etm_mode;
  if (mac == (ssh2_macalg *)0x0) {
    bpp[-1].out_pq.pqb.ic = (IdempotentCallback *)0x0;
  }
  else {
    pIVar6 = (IdempotentCallback *)ssh2_mac_new(mac,(ssh_cipher *)bpp[-1].out_pq.pqb.total_size);
    bpp[-1].out_pq.pqb.ic = pIVar6;
    pIVar6 = bpp[-1].out_pq.pqb.ic;
    key = make_ptrlen(mac_key,(long)mac->keylen);
    ssh2_mac_setkey((ssh2_mac *)pIVar6,key);
    pLVar1 = bpp->logctx;
    pcVar5 = ssh2_mac_text_name((ssh2_mac *)bpp[-1].out_pq.pqb.ic);
    pcVar7 = anon_var_dwarf_2471b + 10;
    if (etm_mode) {
      pcVar7 = " (in ETM mode)";
    }
    bVar11 = false;
    if (bpp[-1].out_pq.pqb.total_size != 0) {
      psVar4 = ssh_cipher_alg((ssh_cipher *)bpp[-1].out_pq.pqb.total_size);
      bVar11 = psVar4->required_mac != (ssh2_macalg *)0x0;
    }
    pcVar10 = anon_var_dwarf_2471b + 10;
    if (bVar11) {
      pcVar10 = " (required by cipher)";
    }
    pcVar5 = dupprintf("Initialised %s inbound MAC algorithm%s%s",pcVar5,pcVar7,pcVar10);
    logevent_and_free(pLVar1,pcVar5);
  }
  if ((delayed_compression) && ((bpp[-1].ic_out_pq.field_0x13 & 1) == 0)) {
    bpp[-1].pls = (PacketLogSettings *)compression;
    bpp[-1].ic_out_pq.fn = (toplevel_callback_fn_t)0x0;
    pLVar1 = bpp->logctx;
    uVar2._0_4_ = bpp[-1].pls[5].kctx;
    uVar2._4_4_ = bpp[-1].pls[5].actx;
    pcVar5 = dupprintf("Will enable %s decompression after user authentication",uVar2);
    logevent_and_free(pLVar1,pcVar5);
  }
  else {
    bpp[-1].pls = (PacketLogSettings *)0x0;
    psVar8 = ssh_decompressor_new(compression);
    bpp[-1].ic_out_pq.fn = (toplevel_callback_fn_t)psVar8;
    if (bpp[-1].ic_out_pq.fn != (toplevel_callback_fn_t)0x0) {
      pLVar1 = bpp->logctx;
      psVar9 = ssh_decompressor_alg((ssh_decompressor *)bpp[-1].ic_out_pq.fn);
      pcVar5 = dupprintf("Initialised %s decompression",psVar9->text_name);
      logevent_and_free(pLVar1,pcVar5);
    }
  }
  bpp[-1].ic_out_pq.field_0x11 = 0;
  queue_idempotent_callback(&bpp->ic_in_raw);
  return;
}

Assistant:

void ssh2_bpp_new_incoming_crypto(
    BinaryPacketProtocol *bpp,
    const ssh_cipheralg *cipher, const void *ckey, const void *iv,
    const ssh2_macalg *mac, bool etm_mode, const void *mac_key,
    const ssh_compression_alg *compression, bool delayed_compression)
{
    struct ssh2_bpp_state *s;
    assert(bpp->vt == &ssh2_bpp_vtable);
    s = container_of(bpp, struct ssh2_bpp_state, bpp);

    ssh2_bpp_free_incoming_crypto(s);

    if (cipher) {
        s->in.cipher = ssh_cipher_new(cipher);
        ssh_cipher_setkey(s->in.cipher, ckey);
        ssh_cipher_setiv(s->in.cipher, iv);

        bpp_logevent("Initialised %s inbound encryption",
                     ssh_cipher_alg(s->in.cipher)->text_name);
    } else {
        s->in.cipher = NULL;
    }
    s->in.etm_mode = etm_mode;
    if (mac) {
        s->in.mac = ssh2_mac_new(mac, s->in.cipher);
        ssh2_mac_setkey(s->in.mac, make_ptrlen(mac_key, mac->keylen));

        bpp_logevent("Initialised %s inbound MAC algorithm%s%s",
                     ssh2_mac_text_name(s->in.mac),
                     etm_mode ? " (in ETM mode)" : "",
                     (s->in.cipher &&
                      ssh_cipher_alg(s->in.cipher)->required_mac ?
                      " (required by cipher)" : ""));
    } else {
        s->in.mac = NULL;
    }

    if (delayed_compression && !s->seen_userauth_success) {
        s->in.pending_compression = compression;
        s->in_decomp = NULL;

        bpp_logevent("Will enable %s decompression after user authentication",
                     s->in.pending_compression->text_name);
    } else {
        s->in.pending_compression = NULL;

        /* 'compression' is always non-NULL, because no compression is
         * indicated by ssh_comp_none. But this setup call may return a
         * null in_decomp. */
        s->in_decomp = ssh_decompressor_new(compression);

        if (s->in_decomp)
            bpp_logevent("Initialised %s decompression",
                         ssh_decompressor_alg(s->in_decomp)->text_name);
    }

    /* Clear the pending_newkeys flag, so that handle_input below will
     * start consuming the input data again. */
    s->pending_newkeys = false;

    /* And schedule a run of handle_input, in case there's already
     * input data in the queue. */
    queue_idempotent_callback(&s->bpp.ic_in_raw);
}